

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gymplayer.cpp
# Opt level: O2

void __thiscall GYMPlayer::~GYMPlayer(GYMPlayer *this)

{
  undefined **ppuVar1;
  
  ppuVar1 = &PTR__GYMPlayer_00185cf8;
  (this->super_PlayerBase)._vptr_PlayerBase = (_func_int **)&PTR__GYMPlayer_00185cf8;
  (this->super_PlayerBase)._eventCbFunc = (PLAYER_EVENT_CB)0x0;
  if ((this->_playState & 1) != 0) {
    Stop(this);
    ppuVar1 = (this->super_PlayerBase)._vptr_PlayerBase;
  }
  (*((_func_int **)ppuVar1)[6])(this);
  if (this->_cpc1252 != (CPCONV *)0x0) {
    CPConv_Deinit(this->_cpc1252);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_devNames);
  std::_Vector_base<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>::~_Vector_base
            (&(this->_devices).
              super__Vector_base<GYMPlayer::GYM_CHIPDEV,_std::allocator<GYMPlayer::GYM_CHIPDEV>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->_pcmBuffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&(this->_tagList).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->_tagData)._M_t);
  std::vector<GYMPlayer::DevCfg,_std::allocator<GYMPlayer::DevCfg>_>::~vector(&this->_devCfgs);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->_decFData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  PlayerBase::~PlayerBase(&this->super_PlayerBase);
  return;
}

Assistant:

GYMPlayer::~GYMPlayer()
{
	_eventCbFunc = NULL;	// prevent any callbacks during destruction
	
	if (_playState & PLAYSTATE_PLAY)
		Stop();
	UnloadFile();
	
	if (_cpc1252 != NULL)
		CPConv_Deinit(_cpc1252);
}